

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ApprovalTestNamer::getFullFileName
          (string *__return_storage_ptr__,ApprovalTestNamer *this,string *approved,
          string *extensionWithDot)

{
  ostream *poVar1;
  string *this_00;
  stringstream ext;
  string sStack_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  getDirectory_abi_cxx11_(&local_1c8,this);
  this_00 = &local_1c8;
  poVar1 = ::std::operator<<(local_198,(string *)this_00);
  getOutputFileBaseName_abi_cxx11_(&sStack_1e8,(ApprovalTestNamer *)this_00);
  poVar1 = ::std::operator<<(poVar1,(string *)&sStack_1e8);
  poVar1 = ::std::operator<<(poVar1,(string *)approved);
  ::std::operator<<(poVar1,(string *)extensionWithDot);
  ::std::__cxx11::string::~string((string *)&sStack_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string
    ApprovalTestNamer::getFullFileName(const std::string& approved,
                                       const std::string& extensionWithDot) const
    {
        std::stringstream ext;
        ext << getDirectory() << getOutputFileBaseName() << approved << extensionWithDot;
        return ext.str();
    }